

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder.cpp
# Opt level: O2

void __thiscall
RenX_LadderPlugin::RenX_OnGameOver
          (RenX_LadderPlugin *this,Server *server,WinType winType,TeamType *team,int gScore,
          int nScore)

{
  long lVar1;
  TeamType TVar2;
  char cVar3;
  long lVar4;
  undefined8 uVar5;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  cVar3 = RenX::Server::isRanked();
  if (cVar3 != '\0') {
    cVar3 = RenX::Server::isReliable();
    if (cVar3 != '\0') {
      lVar1 = *(long *)(server + 0x20);
      lVar4 = RenX::Server::getBotCount();
      if (lVar1 != lVar4) {
        TVar2 = *team;
        uVar5 = Jupiter::Config::operator[]
                          (server + 0x70,*(undefined8 *)&this->field_0x20,
                           *(undefined8 *)&this->field_0x18);
        local_68 = local_58;
        local_60 = 1;
        local_58[1] = 0;
        local_58[0] = (char)TVar2;
        Jupiter::Config::set(uVar5,1,"t",&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        uVar5 = Jupiter::Config::operator[]
                          (server + 0x70,*(undefined8 *)&this->field_0x20,
                           *(undefined8 *)&this->field_0x18);
        s_abi_cxx11_(&local_48,"1",1);
        Jupiter::Config::set(uVar5,1,"w",&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        RenX::Server::updateClientList();
      }
    }
  }
  return;
}

Assistant:

void RenX_LadderPlugin::RenX_OnGameOver(RenX::Server &server, RenX::WinType winType, const RenX::TeamType &team, int gScore, int nScore) {
	if (server.isRanked() && server.isReliable() && server.players.size() != server.getBotCount()) {
		char chr = static_cast<char>(team);
		server.varData[this->name].set("t"sv, std::string(&chr, 1));
		server.varData[this->name].set("w"sv, "1"s);
		server.updateClientList();
	}
}